

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void anon_unknown.dwarf_c172::usageMessage(ostream *stream,char *program_name,bool verbose)

{
  ostream *poVar1;
  byte in_DL;
  char *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"Usage: ");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1," [options] infile outfile");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if ((in_DL & 1) != 0) {
    std::operator<<(in_RDI,
                    "\nConvert an OpenEXR latitude-longitude environment map\ninto a cube-face environment map or vice versa.\nReads an environment map image from infile, converts\nit, and stores the result in outfile.\n\nIf the input file name contains a \'%\' character, then an\ninput cube-face environment map is assembled from six\nsquare sub-images that represent the six faces of the cube.\nThe names of the six image files are generated by replacing\nthe % with +X, -X, +Y, -Y, +Z and -Z respectively.\n\nIf the output file name contains a \'%\' character and\nthe program has been instructed to produce a cube-face\nenvironment map, then the output image is split into six\nsquare sub-images that are saved in six separate output\nfiles.  The names of the files are generated by replacing\nthe % with +X, -X, +Y, -Y, +Z and -Z respectively.\n\nOptions:\n\n  -o            produces a ONE_LEVEL output file (default)\n\n  -m            produces a MIPMAP_LEVELS output file (-m has\n                no effect if the output image is split into\n                multiple files)\n\n  -c            the output file will be a cube-face environment\n                map (default)\n\n  -l            the output file will be a latitude-longitude\n                environment map\n\n  -ci           the input file is interpreted as a cube-face\n                environment map, regardless of its envmap\n                attribute\n\n  -li           the input file is interpreted as a latitude-\n                longitude environment map, regardless of its\n                envmap attribute (-li has no effect if the\n                input image is assembled from multiple files)\n\n  -w x          sets the width of the output image to x pixels\n                (default is 256).  The height of the output image\n                will be x*6 pixels for a cube-face map, or x/2\n                pixels for a latitude-longitude map.\n\n  -f r n        sets the antialiasing filter radius to r\n                (default is 1.0) and the sampling rate to\n                n by n (default is 5 by 5).  Increasing r\n                m..." /* TRUNCATED STRING LITERAL */
                   );
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << " [options] infile outfile" << endl;

    if (verbose)
    {
        stream << "\n"
            "Convert an OpenEXR latitude-longitude environment map\n"
            "into a cube-face environment map or vice versa.\n"
            "Reads an environment map image from infile, converts\n"
            "it, and stores the result in outfile.\n"
            "\n"
            "If the input file name contains a '%' character, then an\n"
            "input cube-face environment map is assembled from six\n"
            "square sub-images that represent the six faces of the cube.\n"
            "The names of the six image files are generated by replacing\n"
            "the % with +X, -X, +Y, -Y, +Z and -Z respectively.\n"
            "\n"
            "If the output file name contains a '%' character and\n"
            "the program has been instructed to produce a cube-face\n"
            "environment map, then the output image is split into six\n"
            "square sub-images that are saved in six separate output\n"
            "files.  The names of the files are generated by replacing\n"
            "the % with +X, -X, +Y, -Y, +Z and -Z respectively.\n"
            "\n"
            "Options:\n"
            "\n"
            "  -o            produces a ONE_LEVEL output file (default)\n"
            "\n"
            "  -m            produces a MIPMAP_LEVELS output file (-m has\n"
            "                no effect if the output image is split into\n"
            "                multiple files)\n"
            "\n"
            "  -c            the output file will be a cube-face environment\n"
            "                map (default)\n"
            "\n"
            "  -l            the output file will be a latitude-longitude\n"
            "                environment map\n"
            "\n"
            "  -ci           the input file is interpreted as a cube-face\n"
            "                environment map, regardless of its envmap\n"
            "                attribute\n"
            "\n"
            "  -li           the input file is interpreted as a latitude-\n"
            "                longitude environment map, regardless of its\n"
            "                envmap attribute (-li has no effect if the\n"
            "                input image is assembled from multiple files)\n"
            "\n"
            "  -w x          sets the width of the output image to x pixels\n"
            "                (default is 256).  The height of the output image\n"
            "                will be x*6 pixels for a cube-face map, or x/2\n"
            "                pixels for a latitude-longitude map.\n"
            "\n"
            "  -f r n        sets the antialiasing filter radius to r\n"
            "                (default is 1.0) and the sampling rate to\n"
            "                n by n (default is 5 by 5).  Increasing r\n"
            "                makes the output image blurrier; decreasing r\n"
            "                makes the image sharper but may cause aliasing.\n"
            "                Increasing n improves antialiasing, but\n"
            "                generating the output image takes longer.\n"
            "\n"
            "  -b            blurs the environment map image by applying a\n"
            "                180-degree-wide filter kernel such that point-\n"
            "                sampling the blurred image at a location that\n"
            "                corresponds to 3D direction N returns the color\n"
            "                that a white diffuse reflector with surface\n"
            "                normal N would have if it was illuminated using\n"
            "                the original non-blurred image.\n"
            "                Generating the blurred image can be fairly slow.\n"
            "\n"
            "  -t x y        sets the output file's tile size to x by y pixels\n"
            "                (default is 64 by 64)\n"
            "\n"
            "  -p t b        if the input image is a latitude-longitude map,\n"
            "                pad the image at the top and bottom with t*h\n"
            "                and b*h extra scan lines, where h is the height\n"
            "                of the input image.  This is useful for images\n"
            "                from 360-degree panoramic scans that cover\n"
            "                less than 180 degrees vertically.\n"
            "\n"
            "  -d            sets level size rounding to ROUND_DOWN (default)\n"
            "\n"
            "  -u            sets level size rounding to ROUND_UP\n"
            "\n"
            "  -z x          sets the data compression method to x\n"
            "                (none/rle/zip/piz/pxr24/b44/b44a/dwaa/dwab,\n"
            "                default is zip)\n"
            "\n"
            "  -v            verbose mode\n"
            "\n"
            "  -h, --help    print this message\n"
            "\n"
            "      --version print version information\n"
            "\n"
            "Report bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
            "";
    }
}